

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::CloseGap
          (RepeatedPtrFieldBase *this,int start,int num)

{
  int i;
  int num_local;
  int start_local;
  RepeatedPtrFieldBase *this_local;
  
  if (this->rep_ != (Rep *)0x0) {
    for (i = start + num; i < this->rep_->allocated_size; i = i + 1) {
      this->rep_->elements[i - num] = this->rep_->elements[i];
    }
    this->current_size_ = this->current_size_ - num;
    this->rep_->allocated_size = this->rep_->allocated_size - num;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::CloseGap(int start, int num) {
  if (rep_ == NULL) return;
  // Close up a gap of "num" elements starting at offset "start".
  for (int i = start + num; i < rep_->allocated_size; ++i)
    rep_->elements[i - num] = rep_->elements[i];
  current_size_ -= num;
  rep_->allocated_size -= num;
}